

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkMarkCone(Wlc_Ntk_t *p,int iCoId,int Range,int fSeq,int fAllPis)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  Vec_Int_t *vFlops;
  int *piVar5;
  
  Wlc_NtkCleanMarks(p);
  if ((fAllPis != 0) && (0 < (p->vPis).nSize)) {
    lVar4 = 0;
    do {
      iVar2 = (p->vPis).pArray[lVar4];
      if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_003698bc;
      *(ushort *)(p->pObjs + iVar2) = *(ushort *)(p->pObjs + iVar2) | 0x80;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vPis).nSize);
  }
  vFlops = (Vec_Int_t *)malloc(0x10);
  vFlops->nCap = 100;
  vFlops->nSize = 0;
  piVar5 = (int *)malloc(400);
  vFlops->pArray = piVar5;
  iVar2 = (p->vCos).nSize;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      iVar1 = (p->vCos).pArray[lVar4];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) goto LAB_003698bc;
      if ((iCoId == -1) || ((iCoId <= lVar4 && (lVar4 < Range + iCoId)))) {
        Wlc_NtkMarkCone_rec(p,p->pObjs + iVar1,vFlops);
        iVar2 = (p->vCos).nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  if ((fSeq != 0) && (0 < vFlops->nSize)) {
    lVar4 = 0;
    do {
      uVar3 = ((p->vPos).nSize + vFlops->pArray[lVar4]) - (p->vPis).nSize;
      if (((int)uVar3 < 0) || ((p->vCos).nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vCos).pArray[uVar3];
      if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) {
LAB_003698bc:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      Wlc_NtkMarkCone_rec(p,p->pObjs + iVar2,vFlops);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vFlops->nSize);
  }
  if (vFlops->pArray != (int *)0x0) {
    free(vFlops->pArray);
  }
  free(vFlops);
  return;
}

Assistant:

void Wlc_NtkMarkCone( Wlc_Ntk_t * p, int iCoId, int Range, int fSeq, int fAllPis )
{
    Vec_Int_t * vFlops;
    Wlc_Obj_t * pObj;
    int i, CiId, CoId;
    Wlc_NtkCleanMarks( p );
    if ( fAllPis )
    Wlc_NtkForEachPi( p, pObj, i )
        pObj->Mark = 1;
    vFlops = Vec_IntAlloc( 100 );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( iCoId == -1 || (i >= iCoId && i < iCoId + Range) )
            Wlc_NtkMarkCone_rec( p, pObj, vFlops );
    if ( fSeq )
    Vec_IntForEachEntry( vFlops, CiId, i )
    {
        CoId = Wlc_NtkPoNum(p) + CiId - Wlc_NtkPiNum(p);
        Wlc_NtkMarkCone_rec( p, Wlc_NtkCo(p, CoId), vFlops );
    }
    Vec_IntFree( vFlops );
}